

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkerHelpers.hpp
# Opt level: O1

bool __thiscall
bredis::marker_helpers::equality<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::
operator()(equality<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *this,
          int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *value)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  buffers_iterator<boost::asio::const_buffer,_char> local_58;
  
  pcVar2 = (this->begin_)._M_current;
  pcVar1 = (this->end_)._M_current;
  local_58.position_ = (value->string).from.position_;
  local_58.current_buffer_.data_ = (value->string).from.current_buffer_.data_;
  local_58.current_buffer_.size_ = (value->string).from.current_buffer_.size_;
  local_58.current_buffer_position_ = (value->string).from.current_buffer_position_;
  local_58.begin_ = (value->string).from.begin_;
  local_58.current_ = (value->string).from.current_;
  local_58.end_ = (value->string).from.end_;
  if ((long)pcVar1 - (long)pcVar2 == (value->string).to.position_ - local_58.position_) {
    for (; pcVar2 != pcVar1; pcVar2 = pcVar2 + 1) {
      bVar3 = *pcVar2 ==
              *(char *)((long)local_58.current_buffer_.data_ + local_58.current_buffer_position_);
      if (!bVar3) {
        return bVar3;
      }
      boost::asio::buffers_iterator<boost::asio::const_buffer,_char>::increment(&local_58);
    }
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator()(const markers::int_t<Iterator> &value) const {
        return boost::algorithm::equal(begin_, end_, value.string.from,
                                       value.string.to);
    }